

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  int iVar1;
  xmlRegexpPtr pxVar2;
  xmlRegTrans *pxVar3;
  long lVar4;
  xmlRegCounter *pxVar5;
  xmlRegStatePtr pxVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *pxVar9;
  long lVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  xmlRegStatePtr pxVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  void *pvVar18;
  long lVar19;
  undefined4 in_R10D;
  int iVar20;
  xmlGenericErrorFunc p_Var21;
  int iVar22;
  long lVar23;
  undefined1 auVar24 [16];
  
  auVar24._0_4_ = -(uint)(exec == (xmlRegExecCtxtPtr)0x0);
  auVar24._4_4_ = -(uint)(nbval == (int *)0x0);
  auVar24._8_4_ = -(uint)(nbneg == (int *)0x0);
  auVar24._12_4_ = -(uint)(values == (xmlChar **)0x0);
  iVar20 = movmskps(in_R10D,auVar24);
  if (iVar20 != 0) {
    return -1;
  }
  iVar20 = *nbval;
  if (iVar20 < 1) {
    return -1;
  }
  *nbval = 0;
  *nbneg = 0;
  pxVar2 = exec->comp;
  if ((pxVar2 == (xmlRegexpPtr)0x0) || (pxVar2->compact == (int *)0x0)) {
    if (terminal != (int *)0x0) {
      *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    if (err == 0) {
      pxVar14 = exec->state;
    }
    else {
      pxVar14 = exec->errState;
    }
    if (pxVar14 == (xmlRegStatePtr)0x0) {
      return -1;
    }
    if (0 < pxVar14->nbTrans) {
      lVar10 = 0x88;
      if (err == 0) {
        lVar10 = 0x40;
      }
      lVar19 = 0x10;
      lVar23 = 1;
      iVar22 = 0;
      do {
        pxVar3 = pxVar14->trans;
        lVar13 = (long)*(int *)((long)pxVar3 + lVar19 + -8);
        if (((lVar13 < 0) || (lVar4 = *(long *)((long)pxVar3 + lVar19 + -0x10), lVar4 == 0)) ||
           (pxVar9 = *(xmlChar **)(lVar4 + 0x18), pxVar9 == (xmlChar *)0x0)) goto LAB_001a61d2;
        iVar17 = *(int *)((long)&pxVar3->atom + lVar19);
        if (iVar17 == 0x123456) {
          pp_Var7 = __xmlGenericError();
          p_Var21 = *pp_Var7;
          ppvVar8 = __xmlGenericErrorContext();
          pvVar18 = *ppvVar8;
          uVar11 = 0x1110;
LAB_001a6175:
          (*p_Var21)(pvVar18,"Unimplemented block at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlregexp.c"
                     ,uVar11);
        }
        else {
          if (iVar17 == 0x123457) {
            pp_Var7 = __xmlGenericError();
            p_Var21 = *pp_Var7;
            ppvVar8 = __xmlGenericErrorContext();
            pvVar18 = *ppvVar8;
            uVar11 = 0x110d;
            goto LAB_001a6175;
          }
          lVar16 = (long)*(int *)((long)pxVar3 + lVar19 + -4);
          if (lVar16 < 0) {
            if (((exec->comp != (xmlRegexpPtr)0x0) &&
                (pxVar6 = exec->comp->states[lVar13], pxVar6 != (xmlRegStatePtr)0x0)) &&
               (pxVar6->type != XML_REGEXP_SINK_STATE)) {
              if (*(int *)(lVar4 + 0x28) != 0) {
                pxVar9 = *(xmlChar **)(lVar4 + 0x20);
              }
              values[iVar22] = pxVar9;
              goto LAB_001a61c8;
            }
          }
          else if (((exec->comp == (xmlRegexpPtr)0x0) ||
                   (pxVar5 = exec->comp->counters, pxVar5 == (xmlRegCounter *)0x0)) ||
                  (*(int *)(*(long *)((long)&exec->status + lVar10) + lVar16 * 4) <
                   pxVar5[lVar16].max)) {
            if (*(int *)(lVar4 + 0x28) != 0) {
              pxVar9 = *(xmlChar **)(lVar4 + 0x20);
            }
            values[iVar22] = pxVar9;
LAB_001a61c8:
            iVar22 = iVar22 + 1;
            *nbval = *nbval + 1;
          }
        }
LAB_001a61d2:
        uVar12 = (ulong)pxVar14->nbTrans;
        if ((long)uVar12 <= lVar23) break;
        lVar19 = lVar19 + 0x18;
        lVar23 = lVar23 + 1;
      } while (iVar22 < iVar20);
      if (iVar20 <= iVar22 || pxVar14->nbTrans < 1) {
        return 0;
      }
      lVar10 = 0x10;
      lVar19 = 1;
      while( true ) {
        pxVar3 = pxVar14->trans;
        lVar23 = (long)*(int *)((long)pxVar3 + lVar10 + -8);
        if (((((-1 < lVar23) && (lVar13 = *(long *)((long)pxVar3 + lVar10 + -0x10), lVar13 != 0)) &&
             (pxVar9 = *(xmlChar **)(lVar13 + 0x18), pxVar9 != (xmlChar *)0x0)) &&
            (((*(uint *)((long)&pxVar3->atom + lVar10) & 0xfffffffe) != 0x123456 &&
             (*(int *)((long)pxVar3 + lVar10 + -4) < 0)))) &&
           ((pxVar6 = exec->comp->states[lVar23], pxVar6 != (xmlRegStatePtr)0x0 &&
            (pxVar6->type == XML_REGEXP_SINK_STATE)))) {
          if (*(int *)(lVar13 + 0x28) != 0) {
            pxVar9 = *(xmlChar **)(lVar13 + 0x20);
          }
          values[iVar22] = pxVar9;
          iVar22 = iVar22 + 1;
          *nbneg = *nbneg + 1;
          uVar12 = (ulong)(uint)pxVar14->nbTrans;
        }
        if ((int)uVar12 <= lVar19) break;
        lVar10 = lVar10 + 0x18;
        lVar19 = lVar19 + 1;
        if (iVar20 <= iVar22) {
          return 0;
        }
      }
      return 0;
    }
  }
  else {
    if (err == 0) {
      iVar22 = exec->index;
    }
    else {
      iVar22 = exec->errStateNo;
      if (iVar22 == -1) {
        return -1;
      }
    }
    if (terminal != (int *)0x0) {
      *terminal = (uint)(pxVar2->compact[(long)iVar22 * ((long)pxVar2->nbstrings + 1)] == 2);
    }
    iVar17 = pxVar2->nbstrings;
    if (0 < iVar17) {
      lVar10 = 0;
      iVar15 = 0;
      do {
        iVar1 = pxVar2->compact[(iVar17 + 1) * iVar22 + lVar10 + 1];
        if (((0 < iVar1) && (iVar1 <= pxVar2->nbstates)) &&
           (pxVar2->compact[(iVar1 + -1) * (iVar17 + 1)] != 4)) {
          lVar19 = (long)iVar15;
          iVar15 = iVar15 + 1;
          values[lVar19] = pxVar2->stringMap[lVar10];
          *nbval = *nbval + 1;
          iVar17 = pxVar2->nbstrings;
        }
        lVar10 = lVar10 + 1;
      } while ((lVar10 < iVar17) && (iVar15 < iVar20));
      if (iVar15 < iVar20 && 0 < iVar17) {
        lVar10 = 0;
        while( true ) {
          iVar1 = pxVar2->compact[(iVar17 + 1) * iVar22 + lVar10 + 1];
          if (((0 < iVar1) && (iVar1 <= pxVar2->nbstates)) &&
             (pxVar2->compact[(iVar1 + -1) * (iVar17 + 1)] == 4)) {
            lVar19 = (long)iVar15;
            iVar15 = iVar15 + 1;
            values[lVar19] = pxVar2->stringMap[lVar10];
            *nbneg = *nbneg + 1;
            iVar17 = pxVar2->nbstrings;
          }
          lVar10 = lVar10 + 1;
          if (iVar17 <= lVar10) break;
          if (iVar20 <= iVar15) {
            return 0;
          }
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}